

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

int deqp::gls::anon_unknown_1::DrawTestShaderProgram::getComponentCount(OutputType *type)

{
  OutputType *type_local;
  
  switch(*type) {
  case OUTPUTTYPE_FLOAT:
  case OUTPUTTYPE_INT:
  case OUTPUTTYPE_UINT:
    type_local._4_4_ = 1;
    break;
  case OUTPUTTYPE_VEC2:
  case OUTPUTTYPE_IVEC2:
  case OUTPUTTYPE_UVEC2:
    type_local._4_4_ = 2;
    break;
  case OUTPUTTYPE_VEC3:
  case OUTPUTTYPE_IVEC3:
  case OUTPUTTYPE_UVEC3:
    type_local._4_4_ = 3;
    break;
  case OUTPUTTYPE_VEC4:
  case OUTPUTTYPE_IVEC4:
  case OUTPUTTYPE_UVEC4:
    type_local._4_4_ = 4;
    break;
  default:
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

int DrawTestShaderProgram::getComponentCount (const DrawTestSpec::OutputType& type)
{
	switch (type)
	{
		case (DrawTestSpec::OUTPUTTYPE_FLOAT):
		case (DrawTestSpec::OUTPUTTYPE_INT):
		case (DrawTestSpec::OUTPUTTYPE_UINT):
			return 1;

		case (DrawTestSpec::OUTPUTTYPE_VEC2):
		case (DrawTestSpec::OUTPUTTYPE_IVEC2):
		case (DrawTestSpec::OUTPUTTYPE_UVEC2):
			return 2;

		case (DrawTestSpec::OUTPUTTYPE_VEC3):
		case (DrawTestSpec::OUTPUTTYPE_IVEC3):
		case (DrawTestSpec::OUTPUTTYPE_UVEC3):
			return 3;

		case (DrawTestSpec::OUTPUTTYPE_VEC4):
		case (DrawTestSpec::OUTPUTTYPE_IVEC4):
		case (DrawTestSpec::OUTPUTTYPE_UVEC4):
			return 4;

		default:
			DE_ASSERT(false);
			return 0;
	}
}